

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuffer.cpp
# Opt level: O3

void __thiscall QBuffer::disconnectNotify(QBuffer *this,QMetaMethod *signal)

{
  QObject ***pppQVar1;
  bool bVar2;
  
  if (signal->mobj == (QMetaObject *)0x0) {
    *(undefined4 *)&(this->super_QIODevice).super_QObject.d_ptr.d[5].children.d.ptr = 0;
  }
  else {
    bVar2 = is_tracked_signal(signal);
    if (bVar2) {
      pppQVar1 = &(this->super_QIODevice).super_QObject.d_ptr.d[5].children.d.ptr;
      *(int *)pppQVar1 = *(int *)pppQVar1 + -1;
    }
  }
  return;
}

Assistant:

void QBuffer::disconnectNotify(const QMetaMethod &signal)
{
    if (signal.isValid()) {
        if (is_tracked_signal(signal))
            d_func()->signalConnectionCount--;
    } else {
        d_func()->signalConnectionCount = 0;
    }
}